

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline.c
# Opt level: O0

symbol * copy_symbol(dmr_C *C,position pos,symbol *sym)

{
  char *pcVar1;
  symbol *sym_local;
  dmr_C *C_local;
  position pos_local;
  
  pos_local = (position)sym;
  if ((sym != (symbol *)0x0) && (((sym->field_14).field_2.ctype.modifiers & 0x84000c) == 0)) {
    if (sym->replace == (symbol *)0x0) {
      pcVar1 = dmrC_show_ident(C,sym->ident);
      dmrC_warning(C,pos,"unreplaced symbol \'%s\'",pcVar1);
    }
    else {
      pos_local = (position)sym->replace;
    }
  }
  return (symbol *)pos_local;
}

Assistant:

static struct symbol *copy_symbol(struct dmr_C *C, struct position pos, struct symbol *sym)
{
	if (!sym)
		return sym;
	if (sym->ctype.modifiers & (MOD_STATIC | MOD_EXTERN | MOD_TOPLEVEL | MOD_INLINE))
		return sym;
	if (!sym->replace) {
		dmrC_warning(C, pos, "unreplaced symbol '%s'", dmrC_show_ident(C, sym->ident));
		return sym;
	}
	return sym->replace;
}